

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 extraout_var;
  LogMessage *other;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint8 *puVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar8 = field_number * 8 + 2;
  uVar3 = (ulong)uVar8;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar8);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    if (0x7f < (uint)(field_number << 3)) {
      do {
        uVar8 = (uint)uVar3;
        *pbVar5 = (byte)uVar3 | 0x80;
        uVar3 = uVar3 >> 7;
        pbVar5 = pbVar5 + 1;
      } while (0x3fff < uVar8);
    }
    *pbVar5 = (byte)uVar3;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  uVar8 = (*value->_vptr_MessageLite[0xf])(value);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar8);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    uVar6 = uVar8;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
    }
    *pbVar5 = (byte)uVar7;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  if (output->buffer_size_ < (int)uVar8) {
    puVar9 = (uint8 *)0x0;
  }
  else {
    puVar9 = output->buffer_;
    output->buffer_ = puVar9 + (int)uVar8;
    output->buffer_size_ = output->buffer_size_ - uVar8;
  }
  if (puVar9 == (uint8 *)0x0) {
    (*value->_vptr_MessageLite[0xd])(value,output);
    return;
  }
  uVar3 = io::CodedOutputStream::default_serialization_deterministic_;
  if (output->serialization_deterministic_is_overridden_ != false) {
    uVar3 = (ulong)output->serialization_deterministic_override_;
  }
  iVar4 = (*value->_vptr_MessageLite[0x10])(value,(ulong)(uVar3 != 0),puVar9);
  if (CONCAT44(extraout_var,iVar4) - (long)puVar9 != (long)(int)uVar8) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x247);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (end - target) == (size): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
}